

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

bool __thiscall Catch::XmlReporter::assertionEnded(XmlReporter *this,AssertionStats *assertionStats)

{
  pointer pMVar1;
  undefined8 this_00;
  AssertionResult *this_01;
  AssertionStats *pAVar2;
  int iVar3;
  OfType OVar4;
  XmlFormatting fmt;
  undefined8 extraout_RDX;
  char cVar5;
  XmlReporter *this_02;
  MessageInfo *msg;
  pointer pMVar6;
  string local_d0;
  allocator local_ab;
  allocator local_aa;
  allocator local_a9;
  undefined1 local_a8 [32];
  undefined1 local_88 [56];
  AssertionResult *local_50;
  AssertionStats *local_48;
  StringRef local_40;
  
  iVar3 = (*(((this->super_StreamingReporterBase<Catch::XmlReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[5])();
  local_88._44_4_ = (undefined4)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
  if (((char)iVar3 == '\0') &&
     ((OVar4 = (assertionStats->assertionResult).m_resultData.resultType, (OVar4 & FailureBit) == Ok
      || (((assertionStats->assertionResult).m_info.resultDisposition & SuppressFail) != 0)))) {
    if (OVar4 != Warning) {
      return true;
    }
    local_88._44_4_ = 0;
  }
  local_50 = &assertionStats->assertionResult;
  pMVar1 = (assertionStats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_88._32_8_ = &this->m_xml;
  cVar5 = (char)local_88._44_4_;
  local_88._48_8_ = this;
  local_48 = assertionStats;
  for (pMVar6 = (assertionStats->infoMessages).
                super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
                super__Vector_impl_data._M_start; pAVar2 = local_48, this_00 = local_88._32_8_,
      pMVar6 != pMVar1; pMVar6 = pMVar6 + 1) {
    fmt = (XmlFormatting)&local_d0;
    if (pMVar6->type == Info && cVar5 == '\x01') {
      std::__cxx11::string::string((string *)&local_d0,"Info",(allocator *)(local_a8 + 0x20));
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)local_88._32_8_,fmt);
      XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&pMVar6->message,Newline|Indent);
LAB_00128dad:
      XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)local_a8);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else if (pMVar6->type == Warning) {
      std::__cxx11::string::string((string *)&local_d0,"Warning",(allocator *)(local_a8 + 0x20));
      XmlWriter::scopedElement((XmlWriter *)local_a8,(string *)local_88._32_8_,fmt);
      XmlWriter::writeText((XmlWriter *)local_a8._0_8_,&pMVar6->message,Newline|Indent);
      goto LAB_00128dad;
    }
  }
  OVar4 = (local_48->assertionResult).m_resultData.resultType;
  if ((byte)((byte)local_88._44_4_ | OVar4 == Warning) != 1) {
    return true;
  }
  this_02 = (XmlReporter *)local_88._48_8_;
  if ((local_48->assertionResult).m_info.capturedExpression.m_size != 0) {
    std::__cxx11::string::string((string *)&local_d0,"Expression",&local_a9);
    this_02 = (XmlReporter *)local_88._48_8_;
    XmlWriter::startElement((XmlWriter *)this_00,&local_d0,Newline|Indent);
    std::__cxx11::string::string((string *)local_a8,"success",&local_aa);
    XmlWriter::writeAttribute
              ((XmlWriter *)this_00,(string *)local_a8,
               ((pAVar2->assertionResult).m_resultData.resultType & FailureBit) == Ok);
    std::__cxx11::string::string((string *)(local_a8 + 0x20),"type",&local_ab);
    local_40.m_start = (pAVar2->assertionResult).m_info.macroName.m_start;
    local_40.m_size = (pAVar2->assertionResult).m_info.macroName.m_size;
    XmlWriter::writeAttribute<Catch::StringRef>
              ((XmlWriter *)this_00,(string *)(local_a8 + 0x20),&local_40);
    std::__cxx11::string::~string((string *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)&local_d0);
    local_d0._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
    local_d0._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
    writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"Original",(allocator *)&local_40);
    XmlWriter::scopedElement
              ((XmlWriter *)(local_a8 + 0x20),(string *)this_00,(XmlFormatting)&local_d0);
    this_01 = local_50;
    AssertionResult::getExpression_abi_cxx11_((string *)local_a8,local_50);
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,(string *)local_a8,Newline|Indent);
    std::__cxx11::string::~string((string *)local_a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::string((string *)&local_d0,"Expanded",(allocator *)&local_40);
    XmlWriter::scopedElement
              ((XmlWriter *)(local_a8 + 0x20),(string *)this_00,(XmlFormatting)&local_d0);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_a8,this_01);
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,(string *)local_a8,Newline|Indent);
    std::__cxx11::string::~string((string *)local_a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)&local_d0);
    OVar4 = (pAVar2->assertionResult).m_resultData.resultType;
  }
  if (OVar4 == Info) {
    std::__cxx11::string::string((string *)&local_d0,"Info",(allocator *)&local_40);
    XmlWriter::scopedElement
              ((XmlWriter *)(local_a8 + 0x20),(string *)this_00,(XmlFormatting)&local_d0);
    std::__cxx11::string::string
              ((string *)local_a8,(string *)&(pAVar2->assertionResult).m_resultData);
    XmlWriter::writeText((XmlWriter *)local_88._0_8_,(string *)local_a8,Newline|Indent);
    std::__cxx11::string::~string((string *)local_a8);
    XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)(local_a8 + 0x20));
    std::__cxx11::string::~string((string *)&local_d0);
  }
  else {
    if (OVar4 == ExplicitFailure) {
      std::__cxx11::string::string((string *)&local_d0,"Failure",(allocator *)local_a8);
      XmlWriter::startElement((XmlWriter *)this_00,&local_d0,Newline|Indent);
      std::__cxx11::string::~string((string *)&local_d0);
      local_d0._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
      local_d0._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
      std::__cxx11::string::string
                ((string *)&local_d0,(string *)&(pAVar2->assertionResult).m_resultData);
      XmlWriter::writeText((XmlWriter *)this_00,&local_d0,Newline|Indent);
    }
    else if (OVar4 == FatalErrorCondition) {
      std::__cxx11::string::string((string *)&local_d0,"FatalErrorCondition",(allocator *)local_a8);
      XmlWriter::startElement((XmlWriter *)this_00,&local_d0,Newline|Indent);
      std::__cxx11::string::~string((string *)&local_d0);
      local_d0._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
      local_d0._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
      std::__cxx11::string::string
                ((string *)&local_d0,(string *)&(pAVar2->assertionResult).m_resultData);
      XmlWriter::writeText((XmlWriter *)this_00,&local_d0,Newline|Indent);
    }
    else {
      if (OVar4 != ThrewException) goto LAB_00129197;
      std::__cxx11::string::string((string *)&local_d0,"Exception",(allocator *)local_a8);
      XmlWriter::startElement((XmlWriter *)this_00,&local_d0,Newline|Indent);
      std::__cxx11::string::~string((string *)&local_d0);
      local_d0._M_dataplus._M_p = (pAVar2->assertionResult).m_info.lineInfo.file;
      local_d0._M_string_length = (pAVar2->assertionResult).m_info.lineInfo.line;
      writeSourceInfo(this_02,(SourceLineInfo *)&local_d0);
      std::__cxx11::string::string
                ((string *)&local_d0,(string *)&(pAVar2->assertionResult).m_resultData);
      XmlWriter::writeText((XmlWriter *)this_00,&local_d0,Newline|Indent);
    }
    std::__cxx11::string::~string((string *)&local_d0);
    XmlWriter::endElement((XmlWriter *)this_00,Newline|Indent);
  }
LAB_00129197:
  if ((pAVar2->assertionResult).m_info.capturedExpression.m_size != 0) {
    XmlWriter::endElement((XmlWriter *)this_00,Newline|Indent);
  }
  return true;
}

Assistant:

bool XmlReporter::assertionEnded( AssertionStats const& assertionStats ) {

        AssertionResult const& result = assertionStats.assertionResult;

        bool includeResults = m_config->includeSuccessfulResults() || !result.isOk();

        if( includeResults || result.getResultType() == ResultWas::Warning ) {
            // Print any info messages in <Info> tags.
            for( auto const& msg : assertionStats.infoMessages ) {
                if( msg.type == ResultWas::Info && includeResults ) {
                    m_xml.scopedElement( "Info" )
                            .writeText( msg.message );
                } else if ( msg.type == ResultWas::Warning ) {
                    m_xml.scopedElement( "Warning" )
                            .writeText( msg.message );
                }
            }
        }

        // Drop out if result was successful but we're not printing them.
        if( !includeResults && result.getResultType() != ResultWas::Warning )
            return true;

        // Print the expression if there is one.
        if( result.hasExpression() ) {
            m_xml.startElement( "Expression" )
                .writeAttribute( "success", result.succeeded() )
                .writeAttribute( "type", result.getTestMacroName() );

            writeSourceInfo( result.getSourceInfo() );

            m_xml.scopedElement( "Original" )
                .writeText( result.getExpression() );
            m_xml.scopedElement( "Expanded" )
                .writeText( result.getExpandedExpression() );
        }

        // And... Print a result applicable to each result type.
        switch( result.getResultType() ) {
            case ResultWas::ThrewException:
                m_xml.startElement( "Exception" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::FatalErrorCondition:
                m_xml.startElement( "FatalErrorCondition" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            case ResultWas::Info:
                m_xml.scopedElement( "Info" )
                    .writeText( result.getMessage() );
                break;
            case ResultWas::Warning:
                // Warning will already have been written
                break;
            case ResultWas::ExplicitFailure:
                m_xml.startElement( "Failure" );
                writeSourceInfo( result.getSourceInfo() );
                m_xml.writeText( result.getMessage() );
                m_xml.endElement();
                break;
            default:
                break;
        }

        if( result.hasExpression() )
            m_xml.endElement();

        return true;
    }